

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O1

void sigbus_handler(int code,siginfo_t *siginfo,void *context)

{
  native_context_t *ucontext;
  DWORD local_d8 [2];
  EXCEPTION_RECORD record;
  EXCEPTION_POINTERS pointers;
  
  if (0 < init_count.m_val) {
    local_d8[0] = CONTEXTGetExceptionCodeForSignal(siginfo,(native_context_t *)context);
    local_d8[1] = 0x100;
    record.ExceptionCode = 0;
    record.ExceptionFlags = 0;
    record.ExceptionRecord = (_EXCEPTION_RECORD *)GetNativeContextPC((native_context_t *)context);
    record.ExceptionAddress._0_4_ = 2;
    record.NumberParameters = 0;
    record._28_4_ = 0;
    record.ExceptionInformation[0] = (siginfo->_sifields)._sigpoll.si_band;
    record.ExceptionInformation[0xe] = (ULONG_PTR)local_d8;
    common_signal_handler
              ((PEXCEPTION_POINTERS)(record.ExceptionInformation + 0xe),code,
               (native_context_t *)context);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (g_previous_sigbus.__sigaction_handler.sa_handler == (__sighandler_t)0x0) {
      restore_signal(code,&g_previous_sigbus);
    }
    else {
      (*g_previous_sigbus.__sigaction_handler.sa_handler)(code);
    }
    return;
  }
  abort();
}

Assistant:

static void sigbus_handler(int code, siginfo_t *siginfo, void *context)
{
    if (PALIsInitialized())
    {
        EXCEPTION_RECORD record;
        EXCEPTION_POINTERS pointers;
        native_context_t *ucontext;

        ucontext = (native_context_t *)context;

        record.ExceptionCode = CONTEXTGetExceptionCodeForSignal(siginfo, ucontext);
        record.ExceptionFlags = EXCEPTION_IS_SIGNAL;
        record.ExceptionRecord = NULL;
        record.ExceptionAddress = GetNativeContextPC(ucontext);
        record.NumberParameters = 2;

        // TODO: First parameter says whether a read (0) or write (non-0) caused the
        // fault. We must disassemble the instruction at record.ExceptionAddress
        // to correctly fill in this value.
        record.ExceptionInformation[0] = 0;

        // Second parameter is the address that caused the fault.
        record.ExceptionInformation[1] = (size_t)siginfo->si_addr;

        pointers.ExceptionRecord = &record;

        common_signal_handler(&pointers, code, ucontext);
    }

    TRACE("SIGBUS signal was unhandled; chaining to previous sigaction\n");

    if (g_previous_sigbus.sa_sigaction != NULL)
    {
        g_previous_sigbus.sa_sigaction(code, siginfo, context);
    }
    else
    {
        // Restore the original or default handler and restart h/w exception
        restore_signal(code, &g_previous_sigbus);
    }
}